

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O3

shared_ptr<Form> __thiscall
LinkedObjectFile::to_form_script
          (LinkedObjectFile *this,int seg,int word_idx,vector<bool,_std::allocator<bool>_> *seen)

{
  pointer pvVar1;
  long lVar2;
  pointer pLVar3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  bool bVar6;
  ulong uVar7;
  undefined8 *puVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  ulong uVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  undefined4 in_register_00000034;
  LinkedObjectFile *this_00;
  ulong uVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  vector<bool,_std::allocator<bool>_> *in_R8;
  uint uVar13;
  uint uVar14;
  reference rVar15;
  shared_ptr<Form> sVar16;
  shared_ptr<Form> fill;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  ulong local_58;
  LinkedObjectFile *local_50;
  _func_int **local_48 [3];
  
  this_00 = (LinkedObjectFile *)CONCAT44(in_register_00000034,seg);
  uVar13 = (int)seen * 4 + 2;
  local_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
  (local_60._M_pi)->_M_use_count = 1;
  (local_60._M_pi)->_M_weak_count = 1;
  (local_60._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0015a6c0;
  local_60._M_pi[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_60._M_pi[1]._M_use_count = 0;
  local_60._M_pi[1]._M_weak_count = 0;
  local_60._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_60._M_pi[2]._M_use_count = 0;
  local_60._M_pi[2]._M_weak_count = 0;
  local_60._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_60._M_pi[3]._M_use_count = 0;
  local_60._M_pi[3]._M_weak_count = 0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->stats).total_v2_pointers =
       local_60._M_pi;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->stats = local_60._M_pi + 1;
  *(undefined4 *)&local_60._M_pi[1]._vptr__Sp_counted_base = 7;
  if (__libc_single_threaded == '\0') {
    LOCK();
    (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    (local_60._M_pi)->_M_use_count = 2;
  }
  local_50 = this;
  if ((uVar13 & 6) != 2) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                  ,0x2e3,
                  "std::shared_ptr<Form> LinkedObjectFile::to_form_script(int, int, std::vector<bool> &)"
                 );
  }
  uVar7 = (ulong)word_idx;
  local_68 = local_60._M_pi + 1;
  local_58 = uVar7;
  do {
    to_form_script_object
              ((LinkedObjectFile *)local_48,seg,word_idx,
               (vector<bool,_std::allocator<bool>_> *)(ulong)(uVar13 - 2));
    p_Var12 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&local_68[1]._M_use_count;
    local_68[1]._vptr__Sp_counted_base = local_48[0];
    *(_func_int ***)&local_68[1]._M_use_count = local_48[1];
    if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
    }
    uVar14 = uVar13 + 3;
    if (-1 < (int)uVar13) {
      uVar14 = uVar13;
    }
    rVar15 = std::vector<bool,_std::allocator<bool>_>::at(in_R8,(long)((int)uVar14 >> 2));
    *rVar15._M_p = *rVar15._M_p | rVar15._M_mask;
    uVar14 = uVar13 + 2;
    bVar6 = is_empty_list(this_00,word_idx,uVar14);
    _Var5 = gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ;
    peVar4 = gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (bVar6) {
      if (gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_68[2]._vptr__Sp_counted_base = (_func_int **)peVar4;
      p_Var12 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&local_68[2]._M_use_count;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&local_68[2]._M_use_count = _Var5._M_pi;
      goto LAB_001304fa;
    }
    pvVar1 = (this_00->words_by_seg).
             super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar10 = ((long)(this_00->words_by_seg).
                    super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
             -0x5555555555555555;
    uVar11 = local_58;
    if (uVar10 < local_58 || uVar10 - local_58 == 0) {
LAB_00130533:
      local_58 = uVar11;
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                 local_58);
    }
    uVar11 = (ulong)((int)uVar14 >> 2);
    lVar2 = *(long *)&pvVar1[uVar7].super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>.
                      _M_impl.super__Vector_impl_data;
    uVar10 = ((long)*(pointer *)
                     ((long)&pvVar1[uVar7].
                             super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>._M_impl.
                             super__Vector_impl_data + 8) - lVar2 >> 4) * -0x5555555555555555;
    if (uVar10 < uVar11 || uVar10 - uVar11 == 0) goto LAB_00130533;
    if (*(int *)(lVar2 + uVar11 * 0x30) != 1) {
LAB_00130499:
      sVar16 = to_form_script_object
                         ((LinkedObjectFile *)local_48,seg,word_idx,
                          (vector<bool,_std::allocator<bool>_> *)(ulong)uVar14);
      p_Var12 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&local_68[2]._M_use_count;
      local_68[2]._vptr__Sp_counted_base = local_48[0];
      *(_func_int ***)&local_68[2]._M_use_count = local_48[1];
      local_68 = sVar16.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._M_pi
      ;
LAB_001304fa:
      if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
        local_68 = extraout_RDX;
      }
      if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
        local_68 = extraout_RDX_00;
      }
      sVar16.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_68;
      sVar16.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_50;
      return (shared_ptr<Form>)sVar16.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>;
    }
    uVar11 = (ulong)*(int *)(lVar2 + uVar11 * 0x30 + 8);
    pLVar3 = (this_00->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = ((long)(this_00->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pLVar3 >> 3) * -0x3333333333333333;
    if (uVar10 < uVar11 || uVar10 - uVar11 == 0) goto LAB_00130533;
    uVar13 = pLVar3[uVar11].offset;
    if ((uVar13 & 7) != 2) goto LAB_00130499;
    puVar8 = (undefined8 *)operator_new(0x40);
    puVar8[1] = 0x100000001;
    *puVar8 = &PTR___Sp_counted_ptr_inplace_0015a6c0;
    p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(puVar8 + 2);
    puVar8[2] = 0;
    puVar8[3] = 0;
    puVar8[4] = 0;
    puVar8[5] = 0;
    puVar8[6] = 0;
    puVar8[7] = 0;
    local_68[2]._vptr__Sp_counted_base = (_func_int **)p_Var9;
    p_Var12 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&local_68[2]._M_use_count;
    *(undefined8 **)&local_68[2]._M_use_count = puVar8;
    if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
      p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68[2]._vptr__Sp_counted_base;
    }
    *(undefined4 *)&p_Var9->_vptr__Sp_counted_base = 7;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_60,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68[2]._M_use_count);
    local_68 = p_Var9;
  } while( true );
}

Assistant:

std::shared_ptr<Form> LinkedObjectFile::to_form_script(int seg,
                                                       int word_idx,
                                                       std::vector<bool>& seen) {
  // the object to currently print. to start off, create pair from the car address we've been given.
  int goal_print_obj = word_idx * 4 + 2;

  // resulting form. we can't have a totally empty list (as an empty list looks like a symbol,
  // so it wouldn't be flagged), so it's safe to make this a pair.
  auto result = std::make_shared<Form>();
  result->kind = FormKind::PAIR;

  // the current pair to fill out.
  auto fill = result;

  // loop until we run out of things to add
  for (;;) {
    // check the thing to print is a a pair.
    if ((goal_print_obj & 7) == 2) {
      // first convert the car (again, with (&-> obj car))
      fill->pair[0] = to_form_script_object(seg, goal_print_obj - 2, seen);
      seen.at(goal_print_obj / 4) = true;

      auto cdr_addr = goal_print_obj + 2;

      if (is_empty_list(seg, cdr_addr)) {
        // the list has ended!
        fill->pair[1] = gSymbolTable.getEmptyPair();
        return result;
      } else {
        // cdr object should be aligned.
        assert((cdr_addr % 4) == 0);
        auto& cdr_word = words_by_seg.at(seg).at(cdr_addr / 4);
        // check for proper list
        if (cdr_word.kind == LinkedWord::PTR && (labels.at(cdr_word.label_id).offset & 7) == 2) {
          // yes, proper list. add another pair and link it in to the list.
          goal_print_obj = labels.at(cdr_word.label_id).offset;
          fill->pair[1] = std::make_shared<Form>();
          fill->pair[1]->kind = FormKind::PAIR;
          fill = fill->pair[1];
        } else {
          // improper list, put the last thing in and end
          fill->pair[1] = to_form_script_object(seg, cdr_addr, seen);
          return result;
        }
      }
    } else {
      // improper list, should be impossible to get here because of earlier checks
      assert(false);
    }
  }

  return result;
}